

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O3

RealType __thiscall OpenMD::AtomType::getMass(AtomType *this)

{
  mapped_type_conflict1 mVar1;
  mapped_type_conflict1 *pmVar2;
  RealType RVar3;
  key_type local_40;
  
  if (this->hasBase_ == true) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"mass","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->myResponsibilities_,&local_40);
    mVar1 = *pmVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (mVar1 == false) {
      RVar3 = getMass(this->base_);
      return RVar3;
    }
  }
  return this->mass_;
}

Assistant:

RealType AtomType::getMass(void) {
    if (hasBase_ && !myResponsibilities_["mass"])
      return base_->getMass();
    else
      return mass_;
  }